

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamHeaderValidator_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::SamHeaderValidator::CheckLengthInRange(SamHeaderValidator *this,string *length)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  _Ios_Openmode _Var2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  uint sequenceLength;
  stringstream lengthStream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200 [24];
  undefined8 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe24;
  stringstream local_1d8 [415];
  allocator local_39;
  string local_38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  uVar3 = std::__cxx11::string::empty();
  pbVar1 = local_18;
  if ((uVar3 & 1) == 0) {
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_1d8,(string *)pbVar1,_Var2);
    std::istream::operator>>((istream *)local_1d8,(uint *)&stack0xfffffffffffffe24);
    if ((in_stack_fffffffffffffe24 == 0) || (0x1fffffff < in_stack_fffffffffffffe24)) {
      std::operator+(&local_220,"Sequence length (LN): ",local_18);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                     &local_220," out of range");
      AddError((SamHeaderValidator *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (string *)in_stack_fffffffffffffe18);
      std::__cxx11::string::~string(local_200);
      std::__cxx11::string::~string((string *)&local_220);
      local_1 = 0;
    }
    else {
      local_1 = 1;
    }
    std::__cxx11::stringstream::~stringstream(local_1d8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Sequence entry (@SQ) is missing LN tag",&local_39);
    AddError((SamHeaderValidator *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (string *)in_stack_fffffffffffffe18);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool SamHeaderValidator::CheckLengthInRange(const std::string& length)
{

    // invalid if empty
    if (length.empty()) {
        AddError("Sequence entry (@SQ) is missing LN tag");
        return false;
    }

    // convert string length to numeric
    std::stringstream lengthStream(length);
    unsigned int sequenceLength;
    lengthStream >> sequenceLength;

    // invalid if length outside accepted range
    if (sequenceLength < Constants::SAM_SQ_LENGTH_MIN ||
        sequenceLength > Constants::SAM_SQ_LENGTH_MAX) {
        AddError("Sequence length (LN): " + length + " out of range");
        return false;
    }

    // otherwise OK
    return true;
}